

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agc.c
# Opt level: O0

int WebRtcAgc_VirtualMic
              (void *agcInst,int16_t **in_near,size_t num_bands,size_t samples,int32_t micLevelIn,
              int32_t *micLevelOut)

{
  int iVar1;
  short local_82;
  uint uStack_80;
  int16_t kZeroCrossingHighLim;
  int16_t kZeroCrossingLowLim;
  int16_t numZeroCrossing;
  uint32_t frameNrgLimit;
  uint32_t frameNrg;
  size_t sampleCntr;
  uint32_t nrg;
  LegacyAgc *stt;
  size_t j;
  size_t ii;
  uint16_t gain;
  int32_t gainIdx;
  int32_t micLevelTmp;
  int32_t tmpFlt;
  int32_t *micLevelOut_local;
  int32_t micLevelIn_local;
  size_t samples_local;
  size_t num_bands_local;
  int16_t **in_near_local;
  void *agcInst_local;
  
  uStack_80 = 0x157c;
  local_82 = 0;
  if (*agcInst != 8000) {
    uStack_80 = 11000;
  }
  _kZeroCrossingLowLim = (int)**in_near * (int)**in_near;
  for (_frameNrgLimit = 1; _frameNrgLimit < samples; _frameNrgLimit = _frameNrgLimit + 1) {
    if (_kZeroCrossingLowLim < uStack_80) {
      _kZeroCrossingLowLim =
           (int)(*in_near)[_frameNrgLimit] * (int)(*in_near)[_frameNrgLimit] + _kZeroCrossingLowLim;
    }
    local_82 = local_82 +
               (ushort)((short)((*in_near)[_frameNrgLimit] ^ (*in_near)[_frameNrgLimit - 1]) < 0);
  }
  if ((_kZeroCrossingLowLim < 500) || (local_82 < 6)) {
    *(undefined2 *)((long)agcInst + 0x298) = 1;
  }
  else if (local_82 < 0x10) {
    *(undefined2 *)((long)agcInst + 0x298) = 0;
  }
  else if (uStack_80 < _kZeroCrossingLowLim) {
    if (local_82 < 0x14) {
      *(undefined2 *)((long)agcInst + 0x298) = 0;
    }
    else {
      *(undefined2 *)((long)agcInst + 0x298) = 1;
    }
  }
  else {
    *(undefined2 *)((long)agcInst + 0x298) = 1;
  }
  iVar1 = micLevelIn << ((byte)*(undefined2 *)((long)agcInst + 0x15c) & 0x1f);
  ii._4_4_ = *(int *)((long)agcInst + 0x13c);
  if (*(int *)((long)agcInst + 0x144) < *(int *)((long)agcInst + 0x13c)) {
    ii._4_4_ = *(int *)((long)agcInst + 0x144);
  }
  if (iVar1 != *(int *)((long)agcInst + 0x130)) {
    *(int *)((long)agcInst + 0x130) = iVar1;
    *(undefined4 *)((long)agcInst + 0x13c) = 0x7f;
    *micLevelOut = 0x7f;
    *(undefined4 *)((long)agcInst + 0x138) = 0x7f;
    ii._4_4_ = 0x7f;
  }
  if (ii._4_4_ < 0x80) {
    ii._2_2_ = kSuppressionTableVirtualMic[0x7f - ii._4_4_];
  }
  else {
    ii._2_2_ = kGainTableVirtualMic[ii._4_4_ + -0x80];
  }
  for (j = 0; j < samples; j = j + 1) {
    gainIdx = (int)((int)(*in_near)[j] * (uint)ii._2_2_) >> 10;
    if (0x7fff < gainIdx) {
      gainIdx = 0x7fff;
      iVar1 = ii._4_4_ + -1;
      if (iVar1 < 0x7f) {
        ii._2_2_ = kSuppressionTableVirtualMic[0x7f - iVar1];
        ii._4_4_ = iVar1;
      }
      else {
        ii._2_2_ = kGainTableVirtualMic[ii._4_4_ + -0x80];
        ii._4_4_ = iVar1;
      }
    }
    if (gainIdx < -0x8000) {
      gainIdx = -0x8000;
      iVar1 = ii._4_4_ + -1;
      if (iVar1 < 0x7f) {
        ii._2_2_ = kSuppressionTableVirtualMic[0x7f - iVar1];
        ii._4_4_ = iVar1;
      }
      else {
        ii._2_2_ = kGainTableVirtualMic[ii._4_4_ + -0x80];
        ii._4_4_ = iVar1;
      }
    }
    (*in_near)[j] = (int16_t)gainIdx;
    for (stt = (LegacyAgc *)0x1; stt < num_bands; stt = (LegacyAgc *)((long)&stt->fs + 1)) {
      gainIdx = (int)((int)in_near[(long)stt][j] * (uint)ii._2_2_) >> 10;
      if (0x7fff < gainIdx) {
        gainIdx = 0x7fff;
      }
      if (gainIdx < -0x8000) {
        gainIdx = -0x8000;
      }
      in_near[(long)stt][j] = (int16_t)gainIdx;
    }
  }
  *(int *)((long)agcInst + 0x138) = ii._4_4_;
  *micLevelOut = *(int *)((long)agcInst + 0x138) >>
                 ((byte)*(undefined2 *)((long)agcInst + 0x15c) & 0x1f);
  iVar1 = WebRtcAgc_AddMic(agcInst,in_near,num_bands,samples);
  if (iVar1 == 0) {
    agcInst_local._4_4_ = 0;
  }
  else {
    agcInst_local._4_4_ = -1;
  }
  return agcInst_local._4_4_;
}

Assistant:

int WebRtcAgc_VirtualMic(void *agcInst, int16_t *const *in_near, size_t num_bands, size_t samples, int32_t micLevelIn,
                         int32_t *micLevelOut) {
    int32_t tmpFlt, micLevelTmp, gainIdx;
    uint16_t gain;
    size_t ii, j;
    LegacyAgc *stt;

    uint32_t nrg;
    size_t sampleCntr;
    uint32_t frameNrg = 0;
    uint32_t frameNrgLimit = 5500;
    int16_t numZeroCrossing = 0;
    const int16_t kZeroCrossingLowLim = 15;
    const int16_t kZeroCrossingHighLim = 20;

    stt = (LegacyAgc *) agcInst;

    /*
     *  Before applying gain decide if this is a low-level signal.
     *  The idea is that digital AGC will not adapt to low-level
     *  signals.
     */
    if (stt->fs != 8000) {
        frameNrgLimit = frameNrgLimit << 1;
    }

    frameNrg = (uint32_t)(in_near[0][0] * in_near[0][0]);
    for (sampleCntr = 1; sampleCntr < samples; sampleCntr++) {
        // increment frame energy if it is less than the limit
        // the correct value of the energy is not important
        if (frameNrg < frameNrgLimit) {
            nrg = (uint32_t)(in_near[0][sampleCntr] * in_near[0][sampleCntr]);
            frameNrg += nrg;
        }

        // Count the zero crossings
        numZeroCrossing += ((in_near[0][sampleCntr] ^ in_near[0][sampleCntr - 1]) < 0);
    }

    if ((frameNrg < 500) || (numZeroCrossing <= 5)) {
        stt->lowLevelSignal = 1;
    } else if (numZeroCrossing <= kZeroCrossingLowLim) {
        stt->lowLevelSignal = 0;
    } else if (frameNrg <= frameNrgLimit) {
        stt->lowLevelSignal = 1;
    } else if (numZeroCrossing >= kZeroCrossingHighLim) {
        stt->lowLevelSignal = 1;
    } else {
        stt->lowLevelSignal = 0;
    }

    micLevelTmp = micLevelIn << stt->scale;
    /* Set desired level */
    gainIdx = stt->micVol;
    if (stt->micVol > stt->maxAnalog) {
        gainIdx = stt->maxAnalog;
    }
    if (micLevelTmp != stt->micRef) {
        /* Something has happened with the physical level, restart. */
        stt->micRef = micLevelTmp;
        stt->micVol = 127;
        *micLevelOut = 127;
        stt->micGainIdx = 127;
        gainIdx = 127;
    }
    /* Pre-process the signal to emulate the microphone level. */
    /* Take one step at a time in the gain table. */
    if (gainIdx > 127) {
        gain = kGainTableVirtualMic[gainIdx - 128];
    } else {
        gain = kSuppressionTableVirtualMic[127 - gainIdx];
    }
    for (ii = 0; ii < samples; ii++) {
        tmpFlt = (in_near[0][ii] * gain) >> 10;
        if (tmpFlt > 32767) {
            tmpFlt = 32767;
            gainIdx--;
            if (gainIdx >= 127) {
                gain = kGainTableVirtualMic[gainIdx - 127];
            } else {
                gain = kSuppressionTableVirtualMic[127 - gainIdx];
            }
        }
        if (tmpFlt < -32768) {
            tmpFlt = -32768;
            gainIdx--;
            if (gainIdx >= 127) {
                gain = kGainTableVirtualMic[gainIdx - 127];
            } else {
                gain = kSuppressionTableVirtualMic[127 - gainIdx];
            }
        }
        in_near[0][ii] = (int16_t) tmpFlt;
        for (j = 1; j < num_bands; ++j) {
            tmpFlt = (in_near[j][ii] * gain) >> 10;
            if (tmpFlt > 32767) {
                tmpFlt = 32767;
            }
            if (tmpFlt < -32768) {
                tmpFlt = -32768;
            }
            in_near[j][ii] = (int16_t) tmpFlt;
        }
    }
    /* Set the level we (finally) used */
    stt->micGainIdx = gainIdx;
    //    *micLevelOut = stt->micGainIdx;
    *micLevelOut = stt->micGainIdx >> stt->scale;
    /* Add to Mic as if it was the output from a true microphone */
    if (WebRtcAgc_AddMic(agcInst, in_near, num_bands, samples) != 0) {
        return -1;
    }
    return 0;
}